

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9VmIsCallable(jx9_vm *pVm,jx9_value *pValue)

{
  undefined8 in_RAX;
  char *pKey;
  SyHashEntry_Pr *pSVar1;
  int nLen;
  sxu32 local_24;
  
  local_24 = (sxu32)((ulong)in_RAX >> 0x20);
  if ((pValue->iFlags & 1) == 0) {
    return 0;
  }
  pKey = jx9_value_to_string(pValue,(int *)&local_24);
  if (((local_24 == 0) || ((pVm->hFunction).nEntry == 0)) ||
     (pSVar1 = HashGetEntry(&pVm->hFunction,pKey,local_24), pSVar1 == (SyHashEntry_Pr *)0x0)) {
    if (local_24 == 0) {
      return 0;
    }
    if ((pVm->hHostFunction).nEntry == 0) {
      return 0;
    }
    pSVar1 = HashGetEntry(&pVm->hHostFunction,pKey,local_24);
    if (pSVar1 == (SyHashEntry_Pr *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

JX9_PRIVATE int jx9VmIsCallable(jx9_vm *pVm, jx9_value *pValue)
{
	int res = 0;
	if( pValue->iFlags & MEMOBJ_STRING ){
		const char *zName;
		int nLen;
		/* Extract the name */
		zName = jx9_value_to_string(pValue, &nLen);
		/* Perform the lookup */
		if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
			SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
				/* Function is callable */
				res = 1;
		}
	}
	return res;
}